

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcSort.c
# Opt level: O0

void Mvc_CoverSort(Mvc_Cover_t *pCover,Mvc_Cube_t *pMask,
                  _func_int_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr *pCompareFunc)

{
  int iVar1;
  Mvc_Cube_t *pMVar2;
  Mvc_Cube_t *pMVar3;
  int nCubes;
  Mvc_Cube_t *pHead;
  _func_int_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr_Mvc_Cube_t_ptr *pCompareFunc_local;
  Mvc_Cube_t *pMask_local;
  Mvc_Cover_t *pCover_local;
  
  iVar1 = Mvc_CoverReadCubeNum(pCover);
  if (1 < iVar1) {
    pMVar2 = Mvc_CoverReadCubeHead(pCover);
    pMVar2 = Mvc_CoverSort_rec(pMVar2,iVar1,pMask,pCompareFunc);
    Mvc_CoverSetCubeHead(pCover,pMVar2);
    pMVar2 = Mvc_ListGetTailFromHead(pMVar2);
    Mvc_CoverSetCubeTail(pCover,pMVar2);
    pMVar2 = Mvc_CoverReadCubeHead(pCover);
    pMVar3 = Mvc_CoverReadCubeTail(pCover);
    iVar1 = (*pCompareFunc)(pMVar2,pMVar3,pMask);
    if (0 < iVar1) {
      __assert_fail("pCompareFunc( Mvc_CoverReadCubeHead(pCover), Mvc_CoverReadCubeTail(pCover), pMask ) <= 0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcSort.c"
                    ,0x3d,
                    "void Mvc_CoverSort(Mvc_Cover_t *, Mvc_Cube_t *, int (*)(Mvc_Cube_t *, Mvc_Cube_t *, Mvc_Cube_t *))"
                   );
    }
  }
  return;
}

Assistant:

void Mvc_CoverSort( Mvc_Cover_t * pCover, Mvc_Cube_t * pMask, int (* pCompareFunc)(Mvc_Cube_t *, Mvc_Cube_t *, Mvc_Cube_t *) )
{
    Mvc_Cube_t * pHead;
    int nCubes;
    // one cube does not need sorting
    nCubes = Mvc_CoverReadCubeNum(pCover);
    if ( nCubes <= 1 )
        return;
    // sort the cubes 
    pHead = Mvc_CoverSort_rec( Mvc_CoverReadCubeHead(pCover), nCubes, pMask, pCompareFunc ); 
    // insert the sorted list into the cover
    Mvc_CoverSetCubeHead( pCover, pHead );
    Mvc_CoverSetCubeTail( pCover, Mvc_ListGetTailFromHead(pHead) );
    // make sure that the list is sorted in the increasing order
    assert( pCompareFunc( Mvc_CoverReadCubeHead(pCover), Mvc_CoverReadCubeTail(pCover), pMask ) <= 0 );
}